

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

QByteArray * QUtf8::convertFromUnicode(QByteArray *__return_storage_ptr__,QStringView in)

{
  char *pcVar1;
  storage_type_conflict *in_RCX;
  char *pcVar2;
  QStringView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(long)in.m_size * 3,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if ((QUtf8 *)pcVar2 == (QUtf8 *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  in_00.m_data = in_RCX;
  pcVar1 = convertFromUnicode((QUtf8 *)pcVar2,(char *)in.m_size,in_00);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  QByteArray::truncate(__return_storage_ptr__,pcVar1 + -(long)pcVar2,__length);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in)
{
    qsizetype len = in.size();

    // create a QByteArray with the worst case scenario size
    QByteArray result(len * 3, Qt::Uninitialized);
    char *dst = const_cast<char *>(result.constData());
    dst = convertFromUnicode(dst, in);
    result.truncate(dst - result.constData());
    return result;
}